

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

int connect_to_pulseaudio(void)

{
  int iVar1;
  long lVar2;
  int process_ret;
  int local_c;
  
  mainloop = (pa_mainloop *)pa_mainloop_new();
  lVar2 = pa_mainloop_get_api(mainloop);
  if (lVar2 != 0) {
    pa = (pa_context *)pa_context_new(lVar2,0);
    if (pa == (pa_context *)0x0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Could not create PulseAudio context.\n",0x25);
      local_c = 1;
    }
    else {
      pa_context_set_state_callback(pa,context_state_callback,0);
      iVar1 = pa_context_connect(pa,0,0,0);
      if (iVar1 < 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Failed to connect.\n",0x13);
        local_c = 2;
      }
      else {
        signal(2,interrupt_loop);
        pa_mainloop_run(mainloop,&local_c);
      }
    }
    return local_c;
  }
  __assert_fail("mainloop_api",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ntrrgc[P]pulse-volume-monitor/main.cpp"
                ,0x3c,"int connect_to_pulseaudio()");
}

Assistant:

int connect_to_pulseaudio() {
    int ret;

    // Use the "simple" mainloop API
    mainloop = pa_mainloop_new();
    pa_mainloop_api* mainloop_api = pa_mainloop_get_api(mainloop);
    assert(mainloop_api);

    // Create a PA context
    pa = pa_context_new(mainloop_api, NULL);
    if (pa == NULL) {
        cerr << "Could not create PulseAudio context.\n";
        return 1;
    }

    // Set the state callback to be notified when the connection succeeds.
    pa_context_set_state_callback(pa, context_state_callback, NULL);

    ret = pa_context_connect(pa, NULL, PA_CONTEXT_NOFLAGS, NULL);
    if (ret < 0) {
        cerr << "Failed to connect.\n";
        return QUIT_RETRY_CONNECT;
    }

    signal(SIGINT, interrupt_loop);

    // The mainloop can return a value, just like UNIX processes
    int process_ret;
    pa_mainloop_run(mainloop, &process_ret);

    return process_ret;
}